

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O3

void mzd_addmul_v_s128_30_192(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  uint i;
  int iVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 uStack_18;
  undefined8 uStack_10;
  
  iVar1 = 0x1e;
  local_48 = c->w64[0];
  uStack_40 = c->w64[1];
  local_38 = c->w64[2];
  uStack_30 = c->w64[3];
  local_28 = 0;
  uStack_20 = 0;
  uStack_18 = 0;
  uStack_10 = 0;
  do {
    auVar3 = vpbroadcastq_avx512vl();
    lVar2 = 0;
    do {
      auVar4 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)A->w64 + lVar2),auVar3,
                                   *(undefined1 (*) [16])((long)&local_48 + lVar2),0x6a);
      *(undefined1 (*) [16])((long)&local_48 + lVar2) = auVar4;
      lVar2 = lVar2 + 0x10;
    } while (lVar2 != 0x20);
    auVar3 = vpbroadcastq_avx512vl();
    lVar2 = 0x20;
    auVar3 = vpsllq_avx(auVar3,0x3e);
    auVar3 = vpsraq_avx512vl(auVar3,0x3f);
    do {
      auVar4 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)A->w64 + lVar2),auVar3,
                                   *(undefined1 (*) [16])((long)&local_48 + lVar2),0x6a);
      *(undefined1 (*) [16])((long)&local_48 + lVar2) = auVar4;
      lVar2 = lVar2 + 0x10;
    } while (lVar2 != 0x40);
    A = A + 2;
    iVar1 = iVar1 + -2;
  } while (iVar1 != 0);
  *(uint *)c->w64 = (uint)local_28 ^ (uint)local_48;
  *(uint *)((long)c->w64 + 4) = local_28._4_4_ ^ local_48._4_4_;
  *(uint *)(c->w64 + 1) = (uint)uStack_20 ^ (uint)uStack_40;
  *(uint *)((long)c->w64 + 0xc) = uStack_20._4_4_ ^ uStack_40._4_4_;
  *(uint *)(c->w64 + 2) = (uint)uStack_18 ^ (uint)local_38;
  *(uint *)((long)c->w64 + 0x14) = uStack_18._4_4_ ^ local_38._4_4_;
  *(uint *)(c->w64 + 3) = (uint)uStack_10 ^ (uint)uStack_30;
  *(uint *)((long)c->w64 + 0x1c) = uStack_10._4_4_ ^ uStack_30._4_4_;
  return;
}

Assistant:

ATTR_TARGET_S128
static inline void mzd_addmul_v_s128_30_256_idx(mzd_local_t* c, mzd_local_t const* A, word idx) {
  block_t* cblock       = BLOCK(c, 0);
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word128 cval[4] = {mm128_load(&cblock->w64[0]), mm128_load(&cblock->w64[2]), mm128_zero,
                     mm128_zero};
  for (unsigned int i = 30; i; i -= 2, idx >>= 2, Ablock += 2) {
    mm128_xor_mask_region(&cval[0], Ablock[0].w64, mm128_compute_mask(idx, 0), 2);
    mm128_xor_mask_region(&cval[2], Ablock[1].w64, mm128_compute_mask(idx, 1), 2);
  }
  mm128_store(&cblock->w64[0], mm128_xor(cval[0], cval[2]));
  mm128_store(&cblock->w64[2], mm128_xor(cval[1], cval[3]));
}